

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_hierarchy_visualize.hpp
# Opt level: O2

vector<SphereTree,_std::allocator<SphereTree>_> *
nextlayer(vector<SphereTree,_std::allocator<SphereTree>_> *__return_storage_ptr__,
         vector<SphereTree,_std::allocator<SphereTree>_> *v)

{
  pointer pSVar1;
  pointer pSVar2;
  SphereTree t;
  SphereTree local_50;
  
  (__return_storage_ptr__->super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1 = (v->super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar2 = (v->super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)._M_impl.
                super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    SphereTree::SphereTree(&local_50,pSVar2);
    std::vector<SphereTree,std::allocator<SphereTree>>::
    insert<__gnu_cxx::__normal_iterator<SphereTree*,std::vector<SphereTree,std::allocator<SphereTree>>>,void>
              ((vector<SphereTree,std::allocator<SphereTree>> *)__return_storage_ptr__,
               (__return_storage_ptr__->super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                )local_50.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                )local_50.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_50.child);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SphereTree> nextlayer(const std::vector<SphereTree>& v)
{
	std::vector<SphereTree> cur;
	for (auto t: v)
		cur.insert(cur.end(), t.child.begin(), t.child.end());
	return cur;
}